

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger default_delegate_tointeger(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQInteger SVar4;
  SQChar *pSVar5;
  longlong x;
  SQRESULT SVar6;
  byte bVar7;
  SQChar *__nptr;
  SQObjectPtr res;
  SQInteger base;
  SQObjectPtr local_30;
  
  pSVar3 = stack_get(v,1);
  base = 10;
  SVar4 = sq_gettop(v);
  if (1 < SVar4) {
    sq_getinteger(v,2,&base);
  }
  SVar1 = (pSVar3->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    res.super_SQObject._unVal.nInteger._1_7_ = 0;
    res.super_SQObject._unVal.nInteger._0_1_ =
         (pSVar3->super_SQObject)._unVal.pTable != (SQTable *)0x0;
    res.super_SQObject._type = OT_INTEGER;
    res.super_SQObject._flags = '\0';
    SQVM::Push(v,&res);
  }
  else if ((SVar1 == OT_INTEGER) || (SVar1 == OT_FLOAT)) {
    if (SVar1 == OT_FLOAT) {
      res.super_SQObject._unVal.nInteger = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
    }
    else {
      res.super_SQObject._unVal = (pSVar3->super_SQObject)._unVal;
    }
    res.super_SQObject._type = OT_INTEGER;
    res.super_SQObject._flags = '\0';
    SQVM::Push(v,&res);
  }
  else {
    if (SVar1 != OT_STRING) {
      SQVM::PushNull(v);
      return 1;
    }
    res.super_SQObject._unVal.pTable = (SQTable *)0x0;
    res.super_SQObject._type = OT_NULL;
    res.super_SQObject._flags = '\0';
    res.super_SQObject._5_3_ = 0;
    __nptr = ((pSVar3->super_SQObject)._unVal.pString)->_val;
    pSVar5 = __nptr;
    do {
      bVar7 = *pSVar5;
      if (bVar7 == 0) {
        x = strtoll(__nptr,(char **)&local_30,(int)base);
        if ((undefined1 *)CONCAT44(local_30.super_SQObject._4_4_,local_30.super_SQObject._type) ==
            __nptr) goto LAB_0011d712;
        SQObjectPtr::operator=(&res,x);
        goto LAB_0011d702;
      }
    } while ((bVar7 != 0x2e) &&
            ((pSVar5 = pSVar5 + 1, 0xd < base || (bVar7 = bVar7 & 0xdf, bVar7 != 0x45))));
    bVar2 = sq_parse_float(__nptr,(SQChar *)&res,(SQObjectPtr *)base,(ulong)bVar7);
    if (!bVar2) {
LAB_0011d712:
      SQObjectPtr::~SQObjectPtr(&res);
      SVar6 = sq_throwerror(v,"cannot convert the string");
      return SVar6;
    }
LAB_0011d702:
    local_30.super_SQObject._unVal = res.super_SQObject._unVal;
    if (res.super_SQObject._type == OT_FLOAT) {
      local_30.super_SQObject._unVal.nInteger = (long)res.super_SQObject._unVal.fFloat;
    }
    local_30.super_SQObject._type = OT_INTEGER;
    local_30.super_SQObject._4_4_ = local_30.super_SQObject._4_4_ & 0xffffff00;
    SQVM::Push(v,&local_30);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  SQObjectPtr::~SQObjectPtr(&res);
  return 1;
}

Assistant:

static SQInteger default_delegate_tointeger(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    SQInteger base = 10;
    if(sq_gettop(v) > 1) {
        sq_getinteger(v,2,&base);
    }
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(sq_parse_int(_stringval(o), _stringval(o) + _string(o)->_len, res, base)){
            v->Push(SQObjectPtr(tointeger(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tointeger(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr(_integer(o)?(SQInteger)1:(SQInteger)0));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}